

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O0

void operator_delete(void *p)

{
  void *p_local;
  
  tcmalloc::InvokeDeleteHook(p);
  DebugDeallocate(p,-0x145237f,0);
  force_frame();
  return;
}

Assistant:

PERFTOOLS_DLL_DECL void tc_delete(void* p) PERFTOOLS_NOTHROW {
  tcmalloc::InvokeDeleteHook(p);
  DebugDeallocate(p, MallocBlock::kNewType, 0);
  force_frame();
}